

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd2D.c
# Opt level: O1

void init_fdtd_2D_medium(fdtd2D *fdtd,init_medium_fun_2D permeability_invR,
                        init_medium_fun_2D permittivity_invR,void *user)

{
  long lVar1;
  void *pvVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  double dVar6;
  float_type fVar7;
  double dVar8;
  
  if (fdtd->sizeX != 0) {
    pvVar4 = fdtd->permittivity_inv;
    pvVar2 = fdtd->permeability_inv;
    lVar1 = fdtd->sizeY * 8;
    dVar6 = 0.0;
    uVar3 = 0;
    do {
      if (fdtd->sizeY != 0) {
        dVar8 = 0.0;
        uVar5 = 0;
        do {
          fVar7 = (*permeability_invR)(dVar6,dVar8,user);
          *(double *)((long)pvVar2 + uVar5 * 8) = 1.0 / (fVar7 * 1.2566370614359173e-06);
          fVar7 = (*permittivity_invR)(dVar6,dVar8,user);
          *(double *)((long)pvVar4 + uVar5 * 8) = 1.0 / (fVar7 * 8.85418781762039e-12);
          uVar5 = uVar5 + 1;
          dVar8 = dVar8 + fdtd->dy;
        } while (uVar5 < fdtd->sizeY);
      }
      uVar3 = uVar3 + 1;
      dVar6 = dVar6 + fdtd->dx;
      pvVar4 = (void *)((long)pvVar4 + lVar1);
      pvVar2 = (void *)((long)pvVar2 + lVar1);
    } while (uVar3 < fdtd->sizeX);
  }
  return;
}

Assistant:

void init_fdtd_2D_medium(struct fdtd2D *fdtd,
                         init_medium_fun_2D permeability_invR,
                         init_medium_fun_2D permittivity_invR, void *user) {
  VLA_2D_definition(float_type, fdtd->sizeX, fdtd->sizeY, permittivity_inv,
                    fdtd->permittivity_inv);
  VLA_2D_definition(float_type, fdtd->sizeX, fdtd->sizeY, permeability_inv,
                    fdtd->permeability_inv);
  float_type posX = float_cst(0.);
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i, posX += fdtd->dx) {
    float_type posY = float_cst(0.);
    for (uintmax_t j = 0; j < fdtd->sizeY; ++j, posY += fdtd->dy) {
      permeability_inv[i][j] =
          float_cst(1.) / (permeability_invR(posX, posY, user) * mu0);
      permittivity_inv[i][j] =
          float_cst(1.) / (permittivity_invR(posX, posY, user) * eps0);
    }
  }
}